

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

ostream * deqp::gles31::bb::operator<<(ostream *str,LayoutFlagsFmt *fmt)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = fmt->flags;
  lVar4 = 8;
  do {
    uVar1 = *(uint *)(&UNK_021b9218 + lVar4);
    if ((uVar1 & uVar3) != 0) {
      if (uVar3 != fmt->flags) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      __s = *(char **)((long)&operator<<::bitDesc[0].bit + lVar4);
      if (__s == (char *)0x0) {
        std::ios::clear((int)str + (int)str->_vptr_basic_ostream[-3]);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar2);
      }
      uVar3 = uVar3 & ~uVar1;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x68);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const LayoutFlagsFmt& fmt)
{
	static const struct
	{
		deUint32	bit;
		const char*	token;
	} bitDesc[] =
	{
		{ LAYOUT_SHARED,		"shared"		},
		{ LAYOUT_PACKED,		"packed"		},
		{ LAYOUT_STD140,		"std140"		},
		{ LAYOUT_STD430,		"std430"		},
		{ LAYOUT_ROW_MAJOR,		"row_major"		},
		{ LAYOUT_COLUMN_MAJOR,	"column_major"	}
	};

	deUint32 remBits = fmt.flags;
	for (int descNdx = 0; descNdx < DE_LENGTH_OF_ARRAY(bitDesc); descNdx++)
	{
		if (remBits & bitDesc[descNdx].bit)
		{
			if (remBits != fmt.flags)
				str << ", ";
			str << bitDesc[descNdx].token;
			remBits &= ~bitDesc[descNdx].bit;
		}
	}
	DE_ASSERT(remBits == 0);
	return str;
}